

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5IndexQuery
              (Fts5Index *p,char *pToken,int nToken,int flags,Fts5Colset *pColset,
              Fts5IndexIter **ppIter)

{
  int *pRc;
  Fts5Buffer *pRight;
  byte *pbVar1;
  u8 **ppuVar2;
  ushort uVar3;
  sqlite3_mutex *psVar4;
  Fts5TombstoneArray *pFVar5;
  Fts5Data *pFVar6;
  Fts5Index *pFVar7;
  sqlite3_blob *pBlob;
  bool bVar8;
  u8 *puVar9;
  undefined1 pTerm [8];
  void *pvVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Fts5Config *pFVar16;
  Fts5Structure *pFVar17;
  undefined8 *p_00;
  Fts5Iter *pFVar18;
  char *zSql;
  Mem *pMem;
  Fts5TokenDataIter *__s;
  code *pcVar19;
  u8 *puVar20;
  long lVar21;
  u32 nByte;
  u32 uVar22;
  ulong uVar23;
  long lVar24;
  Fts5SegIter *pIter;
  uint uVar25;
  sqlite3_int64 nByte_00;
  ulong uVar26;
  Fts5StructureSegment *pSeg;
  size_t __n;
  long lVar27;
  Fts5SegIter *__src;
  Fts5Buffer *pLeft;
  Vdbe *p_1;
  ulong uVar28;
  Vdbe *p_01;
  Fts5Data **ppFVar29;
  long in_FS_OFFSET;
  bool bVar30;
  Fts5Buffer buf;
  Fts5TokenDataIter *local_140;
  Fts5Iter *local_118;
  Fts5Buffer local_b8;
  Fts5Iter *local_a0;
  Fts5TokenDataIter *local_98;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  undefined8 local_78;
  ulong local_70;
  void *pvStack_68;
  undefined8 local_60;
  void *pvStack_58;
  undefined8 local_50;
  Fts5TokenDataIter **ppFStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar16 = p->pConfig;
  local_a0 = (Fts5Iter *)0x0;
  local_b8.p = (u8 *)0x0;
  local_b8.n = 0;
  local_b8.nSpace = 0;
  pRc = &p->rc;
  __n = (long)nToken + 1;
  nByte = (u32)__n;
  iVar12 = sqlite3Fts5BufferSize(pRc,&local_b8,nByte);
  if (iVar12 != 0) goto LAB_001e3f45;
  iVar12 = pFVar16->bTokendata;
  if (nToken < 1) {
    iVar13 = 0;
    if ((flags & 0x88U) != 0) {
      iVar12 = iVar13;
    }
    if ((flags & 1U) == 0) goto LAB_001e31b6;
LAB_001e3212:
    uVar25 = pFVar16->nPrefix;
    if ((int)uVar25 < 1) {
      uVar28 = 1;
LAB_001e3261:
      iVar12 = 0;
    }
    else {
      uVar28 = (ulong)uVar25 + 1;
      uVar23 = 0;
      uVar26 = 1;
      do {
        iVar12 = (int)uVar23;
        if (pFVar16->aPrefix[uVar26 - 1] == iVar13) {
          uVar28 = uVar26 & 0xffffffff;
          break;
        }
        if (pFVar16->aPrefix[uVar26 - 1] == iVar13 + 1) {
          uVar23 = uVar26 & 0xffffffff;
        }
        iVar12 = (int)uVar23;
        uVar26 = uVar26 + 1;
      } while (uVar28 != uVar26);
    }
    puVar9 = local_b8.p;
    if ((int)uVar28 <= (int)uVar25) {
      pFVar17 = fts5StructureRead(p);
      *local_b8.p = (char)uVar28 + '0';
      if (pFVar17 != (Fts5Structure *)0x0) {
        fts5MultiIterNew(p,pFVar17,flags | 0x10,pColset,local_b8.p,nByte,-1,0,&local_a0);
        fts5StructureRelease(pFVar17);
      }
      goto LAB_001e3ef0;
    }
    pvStack_68 = (void *)0x0;
    pvStack_58 = (void *)0x0;
    local_50 = 0;
    ppFStack_48 = (Fts5TokenDataIter **)0x0;
    local_98 = (Fts5TokenDataIter *)0x0;
    uStack_90 = 0;
    local_70 = 1;
    local_78 = 0;
    local_60 = 0x20;
    pFVar16 = p->pConfig;
    if (((iVar12 == 0) && (pFVar16->eDetail == 0)) && (pFVar16->bPrefixInsttoken != 0)) {
      ppFStack_48 = &local_98;
      local_98 = (Fts5TokenDataIter *)sqlite3Fts5MallocZero(pRc,0x40);
      pFVar16 = p->pConfig;
    }
    if (pFVar16->eDetail == 1) {
      uStack_80 = fts5AppendRowid;
      local_88 = (undefined1  [8])fts5MergeRowidLists;
      nByte_00 = 0x200;
    }
    else {
      local_70 = CONCAT44(local_70._4_4_,0xf);
      local_60 = CONCAT44(local_60._4_4_,0x78);
      uStack_80 = fts5AppendPoslist;
      local_88 = (undefined1  [8])fts5MergePrefixLists;
      nByte_00 = 0x780;
    }
    pvStack_68 = sqlite3Fts5MallocZero(pRc,nByte_00);
    pFVar17 = fts5StructureRead(p);
    if (p->rc == 0) {
      if (iVar12 != 0) {
        *puVar9 = '0';
        fts5VisitEntries(p,pColset,puVar9,nByte,0,prefixIterSetupCb,local_88);
      }
      *puVar9 = (char)iVar12 + '0';
      fts5VisitEntries(p,pColset,puVar9,nByte,1,prefixIterSetupCb,local_88);
      if (0 < (int)local_60) {
        uVar28 = local_70 & 0xffffffff;
        iVar12 = 0;
        do {
          if (*pRc == 0) {
            (*(code *)local_88)(p,&pvStack_58,uVar28,
                                (void *)((long)iVar12 * 0x10 + (long)pvStack_68));
            uVar28 = local_70 & 0xffffffff;
          }
          if ((int)uVar28 < 1) {
            iVar13 = iVar12 + (int)uVar28;
          }
          else {
            lVar27 = (long)iVar12;
            lVar24 = lVar27 << 4;
            do {
              pvVar10 = pvStack_68;
              sqlite3_free(*(void **)((long)pvStack_68 + lVar24));
              *(undefined8 *)((long)pvVar10 + lVar24) = 0;
              ((undefined8 *)((long)pvVar10 + lVar24))[1] = 0;
              lVar27 = lVar27 + 1;
              uVar28 = local_70 & 0xffffffff;
              iVar13 = (int)local_70 + iVar12;
              lVar24 = lVar24 + 0x10;
            } while (lVar27 < iVar13);
          }
          iVar12 = iVar13;
        } while (iVar13 < (int)local_60);
      }
      p_00 = (undefined8 *)sqlite3Fts5MallocZero(pRc,(long)(int)local_50 + 0x18);
      if (p_00 != (undefined8 *)0x0) {
        *p_00 = p_00 + 2;
        *(int *)((long)p_00 + 0xc) = (int)local_50;
        *(int *)(p_00 + 1) = (int)local_50;
        if ((long)(int)local_50 != 0) {
          memcpy(p_00 + 2,pvStack_58,(long)(int)local_50);
        }
        pFVar18 = fts5MultiIterAlloc(p,2);
        if (pFVar18 != (Fts5Iter *)0x0) {
          *(undefined4 *)&pFVar18[1].base.pData = 1;
          if (*(int *)((long)p_00 + 0xc) < 1) {
            (pFVar18->base).bEof = '\x01';
          }
          else {
            *(undefined8 **)&pFVar18[1].base.nData = p_00;
            bVar11 = sqlite3Fts5GetVarint((uchar *)*p_00,(u64 *)&pFVar18[1].aSeg[0].flags);
            pFVar18[1].pIndex = (Fts5Index *)(ulong)bVar11;
            *(undefined4 *)((long)&pFVar18[1].xSetOutputs + 4) = *(undefined4 *)(p_00 + 1);
            pFVar18->aFirst[1].iFirst = 1;
            if ((flags & 2U) == 0) {
              fts5SegIterLoadNPos(p,(Fts5SegIter *)(pFVar18 + 1));
            }
            else {
              pFVar18->bRev = 1;
              ppuVar2 = &pFVar18[1].base.pData;
              *(byte *)ppuVar2 = *(byte *)ppuVar2 | 2;
              fts5SegIterReverseInitPage(p,(Fts5SegIter *)(pFVar18 + 1));
            }
            p_00 = (undefined8 *)0x0;
          }
          if (((ulong)pFVar18[1].base.pData & 2) == 0) {
            if (p->pConfig->eDetail == 1) {
              pcVar19 = fts5SegIterNext_None;
            }
            else {
              pcVar19 = fts5SegIterNext;
            }
          }
          else {
            pcVar19 = fts5SegIterNext_Reverse;
          }
          *(code **)&pFVar18[1].poslist.n = pcVar19;
          local_a0 = pFVar18;
        }
        sqlite3_free(p_00);
      }
      pFVar18 = local_a0;
      if ((*pRc == 0) && (ppFStack_48 != (Fts5TokenDataIter **)0x0)) {
        fts5TokendataIterSortMap(p,local_98);
        local_a0->pTokenDataIter = local_98;
        local_98 = (Fts5TokenDataIter *)0x0;
        pFVar18 = local_a0;
      }
    }
    else {
      pFVar18 = (Fts5Iter *)0x0;
    }
    fts5TokendataIterDelete(local_98);
    sqlite3_free(pvStack_58);
    pvStack_58 = (void *)0x0;
    local_50 = 0;
    fts5StructureRelease(pFVar17);
    sqlite3_free(pvStack_68);
    if (pFVar18 == (Fts5Iter *)0x0) goto LAB_001e3ef0;
    fts5IterSetOutputCb(pRc,pFVar18);
    if (*pRc == 0) {
      uVar3 = pFVar18->aFirst[1].iFirst;
      if (pFVar18->aSeg[uVar3].pLeaf != (Fts5Data *)0x0) {
        (*pFVar18->xSetOutputs)(pFVar18,pFVar18->aSeg + uVar3);
      }
      goto LAB_001e3ef0;
    }
LAB_001e3f07:
    fts5IterClose(&pFVar18->base);
    pBlob = p->pReader;
    if (pBlob != (sqlite3_blob *)0x0) {
      p->pReader = (sqlite3_blob *)0x0;
      iVar12 = sqlite3_blob_close(pBlob);
      if (p->rc == 0) {
        *pRc = iVar12;
      }
    }
    pFVar18 = (Fts5Iter *)0x0;
  }
  else {
    memcpy(local_b8.p + 1,pToken,(ulong)(uint)nToken);
    iVar14 = 0;
    if ((flags & 0x88U) != 0) {
      iVar12 = 0;
    }
    if ((flags & 1U) != 0) {
      iVar13 = 0;
      do {
        iVar14 = iVar14 + 1;
        iVar13 = iVar13 + 1;
      } while (iVar14 < nToken);
      goto LAB_001e3212;
    }
LAB_001e31b6:
    puVar9 = local_b8.p;
    if (iVar12 == 0) {
      uVar25 = pFVar16->nPrefix;
      uVar28 = 0;
      goto LAB_001e3261;
    }
    *local_b8.p = '0';
    local_88 = (undefined1  [8])0x0;
    uStack_80 = (code *)0x0;
    fts5IndexFlush(p);
    pFVar17 = fts5StructureRead(p);
    bVar30 = p->rc == 0;
    if (bVar30) {
      local_140 = (Fts5TokenDataIter *)0x0;
      pLeft = (Fts5Buffer *)0x0;
LAB_001e3626:
      do {
        if (local_140 == (Fts5TokenDataIter *)0x0) {
          local_118 = (Fts5Iter *)0x0;
        }
        else {
          local_118 = local_140->apIter[(long)local_140->nIter + -1];
        }
        pFVar18 = fts5MultiIterAlloc(p,pFVar17->nSegment);
        if (pLeft == (Fts5Buffer *)0x0) {
          uStack_80 = (code *)((ulong)uStack_80._4_4_ << 0x20);
          puVar20 = puVar9;
          uVar22 = nByte;
        }
        else {
          uStack_80 = (code *)((ulong)uStack_80._4_4_ << 0x20);
          sqlite3Fts5BufferAppendBlob(pRc,(Fts5Buffer *)local_88,pLeft->n,pLeft->p);
          puVar20 = (u8 *)"";
          uVar22 = 1;
        }
        sqlite3Fts5BufferAppendBlob(pRc,(Fts5Buffer *)local_88,uVar22,puVar20);
        if (*pRc != 0) {
          fts5IterClose(&pFVar18->base);
          break;
        }
        if (0 < pFVar17->nLevel) {
          pIter = pFVar18->aSeg;
          __src = local_118->aSeg;
          if (local_118 == (Fts5Iter *)0x0) {
            __src = (Fts5SegIter *)0x0;
          }
          lVar24 = 0;
          do {
            pTerm = local_88;
            uVar25 = pFVar17->aLevel[lVar24].nSeg;
            iVar12 = (int)uStack_80;
            lVar21 = (long)(int)uStack_80;
            iVar13 = uVar25 + 1;
            lVar27 = (ulong)uVar25 * 0x38;
            do {
              iVar13 = iVar13 + -1;
              if (iVar13 < 1) break;
              pSeg = (Fts5StructureSegment *)
                     ((long)&pFVar17->aLevel[lVar24].aSeg[-1].iSegid + lVar27);
              if (__src == (Fts5SegIter *)0x0) {
                fts5SegIterSeekInit(p,(u8 *)pTerm,iVar12,0x108,pSeg,pIter);
                fts5SegIterAllocTombstone(p,pIter);
              }
              else {
                iVar14 = fts5BufferCompare(pLeft,&__src->term);
                if (iVar14 == 0) {
                  if (__src->pLeaf->szLeaf < __src->iEndofDoclist) {
                    p_01 = (Vdbe *)p->pIdxNextSelect;
                    if (p_01 == (Vdbe *)0x0) {
                      zSql = sqlite3_mprintf("SELECT pgno FROM \'%q\'.\'%q_idx\' WHERE segid=? AND term>? ORDER BY term ASC LIMIT 1"
                                             ,p->pConfig->zDb,p->pConfig->zName);
                      fts5IndexPrepareStmt(p,&p->pIdxNextSelect,zSql);
                      p_01 = (Vdbe *)p->pIdxNextSelect;
                      if (p_01 != (Vdbe *)0x0) goto LAB_001e3863;
                      uVar25 = 0;
                      iVar15 = -1;
                    }
                    else {
LAB_001e3863:
                      sqlite3_bind_int64((sqlite3_stmt *)p_01,1,(long)pSeg->iSegid);
                      uVar25 = 0;
                      bindText((sqlite3_stmt *)p_01,2,(void *)pTerm,lVar21 + -1,
                               (_func_void_void_ptr *)0x0,'\0');
                      iVar14 = sqlite3_step((sqlite3_stmt *)p_01);
                      iVar15 = -1;
                      if (iVar14 == 100) {
                        pMem = columnMem((sqlite3_stmt *)p_01,0);
                        uVar28 = sqlite3VdbeIntValue(pMem);
                        columnMallocFailure((sqlite3_stmt *)p_01);
                        iVar15 = (int)(uVar28 >> 1);
                        uVar25 = (uint)uVar28 & 1;
                      }
                      iVar14 = sqlite3_reset((sqlite3_stmt *)p_01);
                      *pRc = iVar14;
                      iVar14 = vdbeUnbind(p_01,1);
                      if ((iVar14 == 0) &&
                         (psVar4 = p_01->db->mutex, psVar4 != (sqlite3_mutex *)0x0)) {
                        (*sqlite3Config.mutex.xMutexLeave)(psVar4);
                      }
                      if (*pRc != 0) goto LAB_001e3955;
                    }
                    pIter->pSeg = (Fts5StructureSegment *)0x0;
                    pIter->flags = 0;
                    pIter->iLeafPgno = 0;
                    pIter->iRowid = 0;
                    pIter->nPos = 0;
                    pIter->bDel = '\0';
                    *(undefined3 *)&pIter->field_0x7d = 0;
                    (pIter->term).p = (u8 *)0x0;
                    (pIter->term).n = 0;
                    (pIter->term).nSpace = 0;
                    pIter->aRowidOffset = (int *)0x0;
                    pIter->pDlidx = (Fts5DlidxIter *)0x0;
                    pIter->iPgidxOff = 0;
                    pIter->iEndofDoclist = 0;
                    pIter->iRowidOffset = 0;
                    pIter->nRowidOffset = 0;
                    pIter->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
                    pIter->iTermLeafPgno = 0;
                    pIter->iTermLeafOffset = 0;
                    pIter->iLeafOffset = 0;
                    pIter->pTombArray = (Fts5TombstoneArray *)0x0;
                    pIter->pLeaf = (Fts5Data *)0x0;
                    pIter->pNextLeaf = (Fts5Data *)0x0;
                    pIter->pSeg = pSeg;
                    *(byte *)&pIter->flags = (byte)pIter->flags | 1;
                    if (-1 < iVar15) {
                      pIter->iLeafPgno = iVar15 + -1;
                      fts5SegIterNextPage(p,pIter);
                      if ((pIter->flags & 2) == 0) {
                        if (p->pConfig->eDetail == 1) {
                          pcVar19 = fts5SegIterNext_None;
                        }
                        else {
                          pcVar19 = fts5SegIterNext;
                        }
                      }
                      else {
                        pcVar19 = fts5SegIterNext_Reverse;
                      }
                      pIter->xNext = pcVar19;
                    }
                    pFVar6 = pIter->pLeaf;
                    if (pFVar6 != (Fts5Data *)0x0) {
                      puVar20 = pFVar6->p;
                      local_98 = (Fts5TokenDataIter *)((ulong)local_98 & 0xffffffff00000000);
                      iVar14 = pFVar6->szLeaf;
                      pIter->iPgidxOff = iVar14;
                      iVar15 = sqlite3Fts5GetVarint32(puVar20 + iVar14,(u32 *)&local_98);
                      pIter->iPgidxOff = iVar15 + iVar14;
                      pIter->iLeafOffset = (long)(int)local_98;
                      fts5SegIterLoadTerm(p,pIter,0);
                      fts5SegIterLoadNPos(p,pIter);
                      if (uVar25 != 0) {
                        fts5SegIterLoadDlidx(p,pIter);
                      }
                    }
                  }
                  else {
                    fts5SegIterSeekInit(p,(u8 *)pTerm,iVar12,0x108,pSeg,pIter);
                  }
                }
                else {
                  memcpy(pIter,__src,0x80);
                  __src->pSeg = (Fts5StructureSegment *)0x0;
                  __src->flags = 0;
                  __src->iLeafPgno = 0;
                  __src->pLeaf = (Fts5Data *)0x0;
                  __src->pNextLeaf = (Fts5Data *)0x0;
                  __src->iLeafOffset = 0;
                  __src->pTombArray = (Fts5TombstoneArray *)0x0;
                  __src->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
                  __src->iTermLeafPgno = 0;
                  __src->iTermLeafOffset = 0;
                  __src->iPgidxOff = 0;
                  __src->iEndofDoclist = 0;
                  __src->iRowidOffset = 0;
                  __src->nRowidOffset = 0;
                  __src->aRowidOffset = (int *)0x0;
                  __src->pDlidx = (Fts5DlidxIter *)0x0;
                  (__src->term).p = (u8 *)0x0;
                  (__src->term).n = 0;
                  (__src->term).nSpace = 0;
                  __src->iRowid = 0;
                  __src->nPos = 0;
                  __src->bDel = '\0';
                  *(undefined3 *)&__src->field_0x7d = 0;
                }
LAB_001e3955:
                pFVar5 = __src->pTombArray;
                if (pFVar5 != (Fts5TombstoneArray *)0x0) {
                  pIter->pTombArray = pFVar5;
                  pFVar5->nRef = pFVar5->nRef + 1;
                }
              }
              pIter = pIter + 1;
              if (__src != (Fts5SegIter *)0x0) {
                __src = __src + 1;
              }
              lVar27 = lVar27 + -0x38;
            } while (*pRc == 0);
            lVar24 = lVar24 + 1;
          } while (lVar24 < pFVar17->nLevel);
        }
        if ((local_118 != (Fts5Iter *)0x0) && (local_118->aSeg[0].pLeaf == (Fts5Data *)0x0)) {
          pFVar7 = local_118->pIndex;
          uVar22 = pLeft->n;
          puVar20 = pLeft->p;
          local_118->aSeg[0].term.n = 0;
          sqlite3Fts5BufferAppendBlob(&pFVar7->rc,&local_118->aSeg[0].term,uVar22,puVar20);
        }
        pFVar18->bSkipEmpty = '\x01';
        pFVar18->pColset = pColset;
        fts5IterSetOutputCb(pRc,pFVar18);
        if (pFVar18->nSeg < 1) {
LAB_001e3cb4:
          fts5IterClose(&pFVar18->base);
          break;
        }
        ppFVar29 = &pFVar18->aSeg[0].pLeaf;
        lVar24 = 0;
        pLeft = (Fts5Buffer *)0x0;
        do {
          pRight = (Fts5Buffer *)(ppFVar29 + 10);
          uVar22 = *(u32 *)(ppFVar29 + 0xb);
          if (nToken < (int)uVar22) {
            puVar20 = pRight->p;
            iVar12 = bcmp(puVar20,puVar9,__n);
            if ((iVar12 != 0) || ((uVar22 != nByte && (puVar20[__n] != '\0')))) goto LAB_001e3b52;
          }
          else {
LAB_001e3b52:
            sqlite3_free(*ppFVar29);
            *ppFVar29 = (Fts5Data *)0x0;
          }
          if ((*ppFVar29 != (Fts5Data *)0x0) &&
             ((pLeft == (Fts5Buffer *)0x0 || (iVar12 = fts5BufferCompare(pLeft,pRight), 0 < iVar12))
             )) {
            pLeft = pRight;
          }
          lVar24 = lVar24 + 1;
          ppFVar29 = ppFVar29 + 0x10;
        } while (lVar24 < pFVar18->nSeg);
        if (pLeft == (Fts5Buffer *)0x0) goto LAB_001e3cb4;
        if (*pRc == 0) {
          if (local_140 == (Fts5TokenDataIter *)0x0) {
            iVar12 = sqlite3_initialize();
            if ((iVar12 == 0) &&
               (__s = (Fts5TokenDataIter *)sqlite3Malloc(0xc0), __s != (Fts5TokenDataIter *)0x0)) {
              memset(__s,0,0xc0);
              iVar12 = 0x10;
LAB_001e3c7e:
              __s->nIterAlloc = iVar12;
              local_140 = __s;
              if (*pRc == 0) {
                iVar12 = __s->nIter;
                goto LAB_001e3c91;
              }
              goto LAB_001e3c41;
            }
          }
          else {
            iVar12 = local_140->nIter;
            if (iVar12 != local_140->nIterAlloc) {
LAB_001e3c91:
              local_140->nIter = iVar12 + 1;
              local_140->apIter[iVar12] = pFVar18;
              goto LAB_001e3626;
            }
            iVar13 = sqlite3_initialize();
            if (iVar13 == 0) {
              uVar25 = iVar12 * 0x10 + 0x40;
              if ((int)uVar25 < 1) {
                uVar25 = 0;
              }
              __s = (Fts5TokenDataIter *)sqlite3Realloc(local_140,(ulong)uVar25);
              if (__s != (Fts5TokenDataIter *)0x0) {
                iVar12 = iVar12 * 2;
                goto LAB_001e3c7e;
              }
            }
          }
          *pRc = 7;
        }
LAB_001e3c41:
        fts5IterClose(&pFVar18->base);
      } while (*pRc == 0);
      iVar12 = *pRc;
      bVar8 = local_140 != (Fts5TokenDataIter *)0x0;
      if (local_140 == (Fts5TokenDataIter *)0x0 || iVar12 != 0) {
LAB_001e3d37:
        if (iVar12 != 0) goto LAB_001e3d71;
      }
      else {
        if (0 < local_140->nIter) {
          lVar24 = 0;
          do {
            pFVar18 = local_140->apIter[lVar24];
            iVar12 = pFVar18->nSeg;
            if (0 < (long)iVar12) {
              lVar27 = 0;
              do {
                pbVar1 = (byte *)((long)&pFVar18->aSeg[0].flags + lVar27);
                *pbVar1 = *pbVar1 | 1;
                lVar27 = lVar27 + 0x80;
              } while ((long)iVar12 * 0x80 != lVar27);
            }
            fts5MultiIterFinishSetup(p,pFVar18);
            lVar24 = lVar24 + 1;
          } while (lVar24 < local_140->nIter);
          iVar12 = *pRc;
          bVar8 = bVar30;
          goto LAB_001e3d37;
        }
        bVar8 = true;
      }
      pFVar18 = fts5MultiIterAlloc(p,0);
      if (pFVar18 == (Fts5Iter *)0x0) goto LAB_001e3d71;
      pFVar18->nSeg = 0;
      pFVar18->pTokenDataIter = local_140;
      if (bVar8) {
        fts5IterSetOutputsTokendata(pFVar18);
      }
      else {
        (pFVar18->base).bEof = '\x01';
      }
    }
    else {
      local_140 = (Fts5TokenDataIter *)0x0;
LAB_001e3d71:
      fts5TokendataIterDelete(local_140);
      pFVar18 = (Fts5Iter *)0x0;
    }
    fts5StructureRelease(pFVar17);
    sqlite3_free((void *)local_88);
    local_a0 = pFVar18;
LAB_001e3ef0:
    pFVar18 = local_a0;
    if (*pRc != 0) goto LAB_001e3f07;
  }
  *ppIter = &pFVar18->base;
  sqlite3_free(local_b8.p);
LAB_001e3f45:
  iVar12 = *pRc;
  *pRc = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar12;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5IndexQuery(
  Fts5Index *p,                   /* FTS index to query */
  const char *pToken, int nToken, /* Token (or prefix) to query for */
  int flags,                      /* Mask of FTS5INDEX_QUERY_X flags */
  Fts5Colset *pColset,            /* Match these columns only */
  Fts5IndexIter **ppIter          /* OUT: New iterator object */
){
  Fts5Config *pConfig = p->pConfig;
  Fts5Iter *pRet = 0;
  Fts5Buffer buf = {0, 0, 0};

  /* If the QUERY_SCAN flag is set, all other flags must be clear. */
  assert( (flags & FTS5INDEX_QUERY_SCAN)==0 || flags==FTS5INDEX_QUERY_SCAN );

  if( sqlite3Fts5BufferSize(&p->rc, &buf, nToken+1)==0 ){
    int iIdx = 0;                 /* Index to search */
    int iPrefixIdx = 0;           /* +1 prefix index */
    int bTokendata = pConfig->bTokendata;
    assert( buf.p!=0 );
    if( nToken>0 ) memcpy(&buf.p[1], pToken, nToken);

    /* The NOTOKENDATA flag is set when each token in a tokendata=1 table
    ** should be treated individually, instead of merging all those with
    ** a common prefix into a single entry. This is used, for example, by
    ** queries performed as part of an integrity-check, or by the fts5vocab
    ** module.  */
    if( flags & (FTS5INDEX_QUERY_NOTOKENDATA|FTS5INDEX_QUERY_SCAN) ){
      bTokendata = 0;
    }

    /* Figure out which index to search and set iIdx accordingly. If this
    ** is a prefix query for which there is no prefix index, set iIdx to
    ** greater than pConfig->nPrefix to indicate that the query will be
    ** satisfied by scanning multiple terms in the main index.
    **
    ** If the QUERY_TEST_NOIDX flag was specified, then this must be a
    ** prefix-query. Instead of using a prefix-index (if one exists),
    ** evaluate the prefix query using the main FTS index. This is used
    ** for internal sanity checking by the integrity-check in debug
    ** mode only.  */
#ifdef SQLITE_DEBUG
    if( pConfig->bPrefixIndex==0 || (flags & FTS5INDEX_QUERY_TEST_NOIDX) ){
      assert( flags & FTS5INDEX_QUERY_PREFIX );
      iIdx = 1+pConfig->nPrefix;
    }else
#endif
    if( flags & FTS5INDEX_QUERY_PREFIX ){
      int nChar = fts5IndexCharlen(pToken, nToken);
      for(iIdx=1; iIdx<=pConfig->nPrefix; iIdx++){
        int nIdxChar = pConfig->aPrefix[iIdx-1];
        if( nIdxChar==nChar ) break;
        if( nIdxChar==nChar+1 ) iPrefixIdx = iIdx;
      }
    }

    if( bTokendata && iIdx==0 ){
      buf.p[0] = FTS5_MAIN_PREFIX;
      pRet = fts5SetupTokendataIter(p, buf.p, nToken+1, pColset);
    }else if( iIdx<=pConfig->nPrefix ){
      /* Straight index lookup */
      Fts5Structure *pStruct = fts5StructureRead(p);
      buf.p[0] = (u8)(FTS5_MAIN_PREFIX + iIdx);
      if( pStruct ){
        fts5MultiIterNew(p, pStruct, flags | FTS5INDEX_QUERY_SKIPEMPTY,
            pColset, buf.p, nToken+1, -1, 0, &pRet
        );
        fts5StructureRelease(pStruct);
      }
    }else{
      /* Scan multiple terms in the main index for a prefix query. */
      int bDesc = (flags & FTS5INDEX_QUERY_DESC)!=0;
      fts5SetupPrefixIter(p, bDesc, iPrefixIdx, buf.p, nToken+1, pColset,&pRet);
      if( pRet==0 ){
        assert( p->rc!=SQLITE_OK );
      }else{
        assert( pRet->pColset==0 );
        fts5IterSetOutputCb(&p->rc, pRet);
        if( p->rc==SQLITE_OK ){
          Fts5SegIter *pSeg = &pRet->aSeg[pRet->aFirst[1].iFirst];
          if( pSeg->pLeaf ) pRet->xSetOutputs(pRet, pSeg);
        }
      }
    }

    if( p->rc ){
      fts5IterClose((Fts5IndexIter*)pRet);
      pRet = 0;
      fts5IndexCloseReader(p);
    }

    *ppIter = (Fts5IndexIter*)pRet;
    sqlite3Fts5BufferFree(&buf);
  }
  return fts5IndexReturn(p);
}